

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Int64Value::InternalSwap(Int64Value *this,Int64Value *other)

{
  void *pvVar1;
  int64 iVar2;
  UnknownFieldSet *other_00;
  
  pvVar1 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar1 & 1) == 0) goto LAB_0033a636;
LAB_0033a625:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar1 & 1) != 0) goto LAB_0033a625;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
LAB_0033a636:
  iVar2 = this->value_;
  this->value_ = other->value_;
  other->value_ = iVar2;
  return;
}

Assistant:

void Int64Value::InternalSwap(Int64Value* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(value_, other->value_);
}